

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O3

Type * __thiscall soul::Type::createArray(Type *__return_storage_ptr__,Type *this,ArraySize size)

{
  Category CVar1;
  Primitive PVar2;
  Structure *pSVar3;
  
  CVar1 = this->category;
  if ((((CVar1 != invalid) && (CVar1 != array)) && (this->isRef == false)) &&
     ((this->isConstant == false && (PVar2 = (this->primitiveType).type, PVar2 != void_)))) {
    __return_storage_ptr__->category = array;
    *(undefined8 *)&__return_storage_ptr__->isRef = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->boundingSize + 2) = 0;
    (__return_storage_ptr__->structure).object = (Structure *)0x0;
    __return_storage_ptr__->boundingSize = (BoundedIntSize)size;
    __return_storage_ptr__->arrayElementCategory = CVar1;
    (__return_storage_ptr__->primitiveType).type = PVar2;
    if ((CVar1 - 4 < 2) || (CVar1 == vector)) {
      __return_storage_ptr__->arrayElementBoundingSize = this->boundingSize;
    }
    else if (CVar1 == structure) {
      pSVar3 = getStructRef(this);
      (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
      (__return_storage_ptr__->structure).object = pSVar3;
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
    }
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("canBeArrayElementType()","createArray",0x108);
}

Assistant:

bool Type::isValid() const                { return category != Category::invalid; }